

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

BasicBlock * __thiscall
FlowGraph::InsertCompensationCodeForBlockMove
          (FlowGraph *this,FlowEdge *edge,bool insertToLoopList,bool sinkBlockLoop,bool afterForward
          )

{
  uint uVar1;
  BasicBlock *targetBlock;
  BasicBlock *pBVar2;
  BasicBlock *targetBlock_00;
  Instr *this_00;
  Func *func;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  BOOL BVar6;
  BasicBlock *compBlock;
  BasicBlock *pBVar7;
  LabelInstr *branchTarget;
  LabelInstr *this_01;
  BranchInstr *pBVar8;
  undefined4 *puVar9;
  MultiBranchInstr *this_02;
  Func **ppFVar10;
  undefined7 in_register_00000011;
  long lVar11;
  Loop *pLVar12;
  BasicBlock *blNext;
  
  compBlock = BasicBlock::New(this);
  targetBlock = edge->predBlock;
  pBVar2 = targetBlock->next;
  ppFVar10 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar10 = &targetBlock->func;
  }
  lVar11 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar11 = 0xd0;
  }
  targetBlock_00 = edge->succBlock;
  this_00 = *(Instr **)((long)&(*ppFVar10)->m_alloc + lVar11);
  uVar1 = this->blockCount;
  this->blockCount = uVar1 + 1;
  compBlock->number = uVar1;
  if ((int)CONCAT71(in_register_00000011,insertToLoopList) != 0) {
    if (sinkBlockLoop) {
      if (targetBlock_00->loop == (Loop *)0x0) {
        pLVar12 = (Loop *)0x0;
      }
      else {
        pBVar7 = Loop::GetHeadBlock(targetBlock_00->loop);
        pLVar12 = targetBlock_00->loop;
        if (pBVar7 == targetBlock_00) {
          pLVar12 = pLVar12->parent;
        }
      }
      compBlock->loop = pLVar12;
      InsertCompBlockToLoopList(this,pLVar12,compBlock,targetBlock_00,false);
      uVar5 = 0x400;
    }
    else {
      pLVar12 = targetBlock->loop;
      compBlock->loop = pLVar12;
      InsertCompBlockToLoopList(this,pLVar12,compBlock,targetBlock,true);
      uVar5 = 0x800;
    }
    *(ushort *)&compBlock->field_0x18 = *(ushort *)&compBlock->field_0x18 | uVar5;
  }
  compBlock->next = pBVar2;
  pBVar2->prev = compBlock;
  compBlock->prev = targetBlock;
  targetBlock->next = compBlock;
  BasicBlock::RemoveSucc(targetBlock,targetBlock_00,this,false,false);
  AddEdge(this,targetBlock,compBlock);
  edge->predBlock = compBlock;
  BasicBlock::AddSucc(compBlock,edge,this);
  branchTarget = IR::Instr::AsLabelInstr(targetBlock_00->firstInstr);
  func = (branchTarget->super_Instr).m_func;
  this_01 = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(this_00,&this_01->super_Instr);
  compBlock->firstInstr = &this_01->super_Instr;
  IR::LabelInstr::SetBasicBlock(this_01,compBlock);
  pBVar8 = IR::BranchInstr::New(Br,branchTarget,func);
  IR::Instr::SetByteCodeOffset(&pBVar8->super_Instr,&branchTarget->super_Instr);
  IR::Instr::InsertAfter(&this_01->super_Instr,&pBVar8->super_Instr);
  IR::Instr::SetByteCodeOffset(&this_01->super_Instr,&branchTarget->super_Instr);
  if (this_00->m_kind == InstrKindBranch) {
    pBVar8 = IR::Instr::AsBranchInstr(this_00);
    bVar4 = IR::BranchInstr::IsMultiBranch(pBVar8);
    if ((!bVar4) && (bVar4 = IR::BranchInstr::IsConditional(pBVar8), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x945,"(sourceBr->IsMultiBranch() || sourceBr->IsConditional())",
                         "sourceBr->IsMultiBranch() || sourceBr->IsConditional()");
      if (!bVar4) goto LAB_003face6;
      *puVar9 = 0;
    }
    bVar4 = IR::BranchInstr::IsMultiBranch(pBVar8);
    if (bVar4) {
      this_02 = IR::BranchInstr::AsMultiBrInstr(pBVar8);
      bVar4 = IR::MultiBranchInstr::ReplaceTarget(this_02,branchTarget,this_01);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x949,"(replaced)","replaced");
        if (!bVar4) {
LAB_003face6:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
  }
  if (afterForward) {
    this_01->m_region = branchTarget->m_region;
  }
  else {
    BVar6 = Func::HasTry(this->func);
    if (BVar6 != 0) {
      bVar4 = Func::DoOptimizeTry(this->func);
      if (!bVar4) {
        bVar4 = Func::IsSimpleJit(this->func);
        if (((!bVar4) || ((this->func->field_0x240 & 0x10) == 0)) &&
           (bVar4 = Func::IsLoopBodyInTryFinally(this->func), !bVar4)) {
          return compBlock;
        }
      }
      UpdateRegionForBlock(this,compBlock);
    }
  }
  return compBlock;
}

Assistant:

BasicBlock *
FlowGraph::InsertCompensationCodeForBlockMove(FlowEdge * edge,  bool insertToLoopList /*=false*/, bool sinkBlockLoop /*=false*/, bool afterForward /*=false*/)
{
    BasicBlock * compBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();
    BasicBlock * fallthroughBlock = sourceBlock->next;
    IR::Instr *  sourceLastInstr = sourceBlock->GetLastInstr();

    compBlock->SetBlockNum(this->blockCount++);

    if (insertToLoopList)
    {
        // For flow graph edits in
        if (sinkBlockLoop)
        {
            if (sinkBlock->loop && sinkBlock->loop->GetHeadBlock() == sinkBlock)
            {
                // BLUE 531255: sinkblock may be the head block of new loop, we shouldn't insert compensation block to that loop
                // Insert it to all the parent loop lists.
                compBlock->loop = sinkBlock->loop->parent;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false);
            }
            else
            {
                compBlock->loop = sinkBlock->loop;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false); // sinkBlock or fallthroughBlock?
            }
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSink = true;
#endif
        }
        else
        {
            compBlock->loop = sourceBlock->loop;
            InsertCompBlockToLoopList(compBlock->loop, compBlock, sourceBlock, true);
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSource = true;
#endif
        }
    }

    //
    // Fixup block linkage
    //

    // compensation block is inserted right after sourceBlock
    compBlock->next = fallthroughBlock;
    fallthroughBlock->prev = compBlock;

    compBlock->prev = sourceBlock;
    sourceBlock->next = compBlock;

    //
    // Fixup flow edges
    //
    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, compBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(compBlock);
    compBlock->AddSucc(edge, this);

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *compLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);
    sourceLastInstr->InsertAfter(compLabel);
    compBlock->SetFirstInstr(compLabel);
    compLabel->SetBasicBlock(compBlock);

    // Add br to sinkBlock from compensation block
    IR::BranchInstr *compBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    compBr->SetByteCodeOffset(sinkLabel);
    compLabel->InsertAfter(compBr);
    compBlock->SetLastInstr(compBr);

    compLabel->SetByteCodeOffset(sinkLabel);

    // Fixup flow out of sourceBlock
    if (sourceLastInstr->IsBranchInstr())
    {
        IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
        Assert(sourceBr->IsMultiBranch() || sourceBr->IsConditional());
        if (sourceBr->IsMultiBranch())
        {
            const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, compLabel);
            Assert(replaced);
        }
    }

    if (!afterForward)
    {
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
            (this->func->IsSimpleJit() && this->func->hasBailout) ||
            this->func->IsLoopBodyInTryFinally());

        if (assignRegionsBeforeGlobopt)
        {
            UpdateRegionForBlock(compBlock);
        }
    }
    else
    {
        compLabel->SetRegion(sinkLabel->GetRegion());
    }

    return compBlock;
}